

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxread.c
# Opt level: O2

WebPMuxError WebPMuxGetAnimationParams(WebPMux *mux,WebPMuxAnimParams *params)

{
  WebPMuxError WVar1;
  undefined8 in_RCX;
  WebPData anim;
  
  if (params != (WebPMuxAnimParams *)0x0 && mux != (WebPMux *)0x0) {
    WVar1 = MuxGet(mux,IDX_ANIM,(uint32_t)&anim,
                   (WebPData *)
                   CONCAT71((int7)((ulong)in_RCX >> 8),
                            params == (WebPMuxAnimParams *)0x0 || mux == (WebPMux *)0x0));
    if (WVar1 == WEBP_MUX_NOT_FOUND) {
      WVar1 = WEBP_MUX_NOT_FOUND;
    }
    else if (anim.size < 6) {
      WVar1 = WEBP_MUX_BAD_DATA;
    }
    else {
      params->bgcolor = *(uint32_t *)anim.bytes;
      params->loop_count = (uint)*(ushort *)(anim.bytes + 4);
      WVar1 = WEBP_MUX_OK;
    }
    return WVar1;
  }
  return WEBP_MUX_INVALID_ARGUMENT;
}

Assistant:

WebPMuxError WebPMuxGetAnimationParams(const WebPMux* mux,
                                       WebPMuxAnimParams* params) {
  WebPData anim;
  WebPMuxError err;

  if (mux == NULL || params == NULL) return WEBP_MUX_INVALID_ARGUMENT;

  err = MuxGet(mux, IDX_ANIM, 1, &anim);
  if (err != WEBP_MUX_OK) return err;
  if (anim.size < kChunks[WEBP_CHUNK_ANIM].size) return WEBP_MUX_BAD_DATA;
  params->bgcolor = GetLE32(anim.bytes);
  params->loop_count = GetLE16(anim.bytes + 4);

  return WEBP_MUX_OK;
}